

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O3

int CVmObjString::getp_findAll(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  vm_val_t *pvVar1;
  undefined1 uVar2;
  uint uVar3;
  CRegexSearcherSimple *pCVar4;
  anon_union_8_8_cb74652f_for_val aVar5;
  vm_datatype_t *pvVar6;
  undefined4 uVar7;
  CVmObjPageEntry *this;
  size_t idx;
  int iVar8;
  vm_obj_id_t vVar9;
  char *substr;
  byte *str_00;
  long lVar10;
  byte *str_01;
  vm_val_t *pvVar11;
  uint uVar12;
  byte *pbVar13;
  uint argc_00;
  ulong uVar14;
  ulong len;
  byte *basestr;
  uint local_100;
  int match_len;
  CVmObjPageEntry *local_f8;
  uint local_ec;
  ulong local_e8;
  vm_val_t *local_e0;
  vm_val_t *local_d8;
  size_t local_d0;
  uint local_c4;
  CVmObjPageEntry *local_c0;
  vm_val_t ele;
  int match_cofs;
  vm_rcdesc rc;
  
  if (argc == (uint *)0x0) {
    uVar12 = 0;
  }
  else {
    uVar12 = *argc;
  }
  if (getp_findAll(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_findAll();
  }
  iVar8 = CVmObject::get_prop_check_argc(retval,argc,&getp_findAll::desc);
  pvVar11 = sp_;
  if (iVar8 == 0) {
    len = (ulong)*(ushort *)str;
    pvVar1 = sp_ + -1;
    local_ec = uVar12;
    substr = vm_val_t::get_as_string(pvVar1);
    local_e8 = 0;
    if (substr == (char *)0x0) {
      if ((pvVar1->typ != VM_OBJ) ||
         (uVar3 = pvVar11[-1].val.obj,
         iVar8 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar3 >> 0xc][uVar3 & 0xfff].ptr_ + 8))
                           (G_obj_table_X.pages_[uVar3 >> 0xc] + (uVar3 & 0xfff),
                            CVmObjPattern::metaclass_reg_), iVar8 == 0)) goto LAB_00283425;
      uVar3 = pvVar11[-1].val.obj;
      if (G_obj_table_X.pages_[uVar3 >> 0xc] == (CVmObjPageEntry *)0x0) goto LAB_00283425;
      local_c0 = G_obj_table_X.pages_[uVar3 >> 0xc] + (uVar3 & 0xfff);
    }
    else {
      local_c0 = (CVmObjPageEntry *)0x0;
    }
    if (local_ec < 2) {
      local_100 = 0xfffffffe;
      local_e0 = (vm_val_t *)0x0;
    }
    else {
      pvVar11 = sp_ + -2;
      local_e0 = pvVar11;
      if (sp_[-2].typ == VM_NIL) {
        local_100 = 0xfffffffe;
      }
      else {
        iVar8 = vm_val_t::is_func_ptr(pvVar11);
        if (iVar8 == 0) {
LAB_00283425:
          err_throw(0x900);
        }
        CVmFuncPtr::set((CVmFuncPtr *)&rc,pvVar11);
        uVar2 = (undefined1)(rc.argp)->typ;
        local_100 = (byte)uVar2 & 0x7f;
        if ((char)uVar2 < '\0') {
          local_e8 = 0xffffffff;
        }
        else {
          local_e8 = (ulong)(*(byte *)((long)&(rc.argp)->typ + 1) + local_100);
        }
        local_100 = local_100 - 2;
      }
    }
    vVar9 = CVmObjList::create(0,10);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar9;
    local_f8 = G_obj_table_X.pages_[vVar9 >> 0xc] + (vVar9 & 0xfff);
    uVar14 = (ulong)**(ushort **)((long)&local_f8->ptr_ + 8);
    if (uVar14 != 0) {
      CVmObjList::cons_clear((CVmObjList *)local_f8,0,uVar14 - 1);
    }
    pvVar11 = sp_;
    uVar7 = *(undefined4 *)&retval->field_0x4;
    aVar5 = retval->val;
    sp_ = sp_ + 1;
    pvVar11->typ = retval->typ;
    *(undefined4 *)&pvVar11->field_0x4 = uVar7;
    pvVar11->val = aVar5;
    local_d0 = 0;
    if (len != 0) {
      basestr = (byte *)(str + 2);
      iVar8 = (int)local_e8;
      local_c4 = iVar8 - 2;
      str_01 = basestr;
      pvVar11 = local_e0;
      local_d8 = self_val;
      do {
        str_00 = (byte *)find_substr(local_d8,(char *)basestr,(char *)str_01,len,substr,
                                     (CVmObjPattern *)local_c0,&match_cofs,&match_len);
        if (str_00 == (byte *)0x0) break;
        if (pvVar11 == (vm_val_t *)0x0) {
          vVar9 = create(0,(char *)str_00,(long)match_len);
          ele.typ = VM_OBJ;
          ele.val.obj = vVar9;
        }
        else {
          uVar3 = G_bif_tads_globals_X->rex_searcher->group_cnt_;
          argc_00 = local_c4;
          if ((int)local_e8 == -1) {
            argc_00 = uVar3;
          }
          if ((int)argc_00 <= (int)local_100) {
            argc_00 = local_100;
          }
          uVar14 = (ulong)argc_00;
          if ((int)argc_00 < 1) {
            argc_00 = 0;
          }
          else {
            do {
              pvVar11 = sp_;
              if ((((long)(int)uVar3 < (long)uVar14) ||
                  (pCVar4 = G_bif_tads_globals_X->rex_searcher,
                  *(int *)((long)&(pCVar4->super_CRegexSearcher).stack_.used_ + uVar14 * 8 + 4) < 0)
                  ) || (*(int *)(&(pCVar4->super_CRegexSearcher).field_0x20 + uVar14 * 8) < 0)) {
                pvVar6 = &sp_->typ;
                sp_ = sp_ + 1;
                *pvVar6 = VM_NIL;
              }
              else {
                sp_ = sp_ + 1;
                lVar10 = (long)*(int *)((long)&(pCVar4->super_CRegexSearcher).stack_.used_ +
                                       uVar14 * 8 + 4);
                vVar9 = create(0,(char *)(basestr + lVar10),
                               *(int *)(&(pCVar4->super_CRegexSearcher).field_0x20 + uVar14 * 8) -
                               lVar10);
                pvVar11->typ = VM_OBJ;
                (pvVar11->val).obj = vVar9;
              }
              uVar14 = uVar14 - 1;
              pvVar11 = local_e0;
            } while ((int)uVar14 != 0);
          }
          pvVar1 = sp_;
          if (1 < iVar8 || iVar8 == -1) {
            if (str_00 == basestr || (long)str_00 - (long)basestr < 0) {
              vVar9 = 1;
            }
            else {
              vVar9 = 1;
              pbVar13 = basestr;
              do {
                pbVar13 = pbVar13 + (ulong)(((*pbVar13 >> 5 & 1) != 0) + 1 &
                                           (uint)(*pbVar13 >> 7) * 3) + 1;
                vVar9 = vVar9 + 1;
              } while (pbVar13 < str_00);
            }
            pvVar6 = &sp_->typ;
            sp_ = sp_ + 1;
            *pvVar6 = VM_INT;
            (pvVar1->val).obj = vVar9;
            argc_00 = argc_00 + 1;
          }
          pvVar1 = sp_;
          if (0 < iVar8 || iVar8 == -1) {
            sp_ = sp_ + 1;
            vVar9 = create(0,(char *)str_00,(long)match_len);
            pvVar1->typ = VM_OBJ;
            (pvVar1->val).obj = vVar9;
            argc_00 = argc_00 + 1;
            pvVar11 = local_e0;
          }
          CVmRun::call_func_ptr(&G_interpreter_X,pvVar11,argc_00,&rc,0);
          ele.typ = r0_.typ;
          ele._4_4_ = r0_._4_4_;
          ele.val = r0_.val;
        }
        idx = local_d0;
        this = local_f8;
        CVmObjList::cons_ensure_space((CVmObjList *)local_f8,local_d0,0);
        CVmObjList::cons_set_element((CVmObjList *)this,idx,&ele);
        lVar10 = (long)(((int)str_00 - (int)str_01) + match_len);
        str_01 = str_01 + lVar10;
        len = len - lVar10;
        if ((match_len == 0) && (len != 0)) {
          str_01 = str_01 + (ulong)(((*str_01 >> 5 & 1) != 0) + 1 & (uint)(*str_01 >> 7) * 3) + 1;
        }
        local_d0 = local_d0 + 1;
      } while (len != 0);
    }
    *(short *)*(char **)((long)&local_f8->ptr_ + 8) = (short)local_d0;
    sp_ = sp_ + -(long)(int)(local_ec + 1);
  }
  return 1;
}

Assistant:

int CVmObjString::getp_findAll(VMG_ vm_val_t *retval,
                               const vm_val_t *self_val, const char *str,
                               uint *argc)
{
    /* check arguments */
    uint orig_argc = (argc != 0 ? *argc : 0);
    static CVmNativeCodeDesc desc(1, 1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the string length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* remember the base string */
    const char *basestr = str;

    /* retrieve the string or regex pattern to find */
    vm_val_t *targ = G_stk->get(0);
    const char *targstr = 0;
    CVmObjPattern *targpat = 0;
    if ((targstr = targ->get_as_string(vmg0_)) != 0)
    {
        /* we have a simple string to find */
    }
    else if ((targpat = vm_val_cast(CVmObjPattern, targ)) != 0)
    {
        /* it's a pattern */
    }
    else
    {
        /* we need a string or a pattern; other values are invalid */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* retrieve the filter callback function, if present */
    vm_val_t *func = 0;
    int func_argc_min = 0, func_argc_max = 0;
    vm_rcdesc rc;
    if (orig_argc >= 2 && (func = G_stk->get(1))->typ != VM_NIL)
    {
        /* make sure it's a function */
        if (!func->is_func_ptr(vmg0_))
            err_throw(VMERR_BAD_TYPE_BIF);

        /* note how many arguments the function accepts */
        CVmFuncPtr fd(vmg_ func);
        func_argc_min = fd.get_min_argc();
        func_argc_max = fd.is_varargs() ? -1 : fd.get_max_argc();
    }

    /* 
     *   create a tentative list for the results (we'll resize this as needed
     *   as we add elements) 
     */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, 10));
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* clear it initially and push it for gc protection */
    lst->cons_clear();
    G_stk->push(retval);

    /* repeatedly search for the pattern */
    int cnt;
    for (cnt = 0 ; len != 0 ; ++cnt)
    {
        /* search for the next element */
        int match_cofs, match_len, match_bofs;
        const char *nxt = find_substr(
            vmg_ self_val, basestr, str, len, targstr, targpat,
            &match_cofs, &match_len);

        /* if we didn't find a match, we're done */
        if (nxt == 0)
            break;

        /* figure the byte offset of the match */
        match_bofs = nxt - str;

        /* call the callback, or just return the match text directly */
        vm_val_t ele;
        if (func == 0)
        {
            /* no callback - just use the match text, as a new string */
            ele.set_obj(CVmObjString::create(vmg_ FALSE, nxt, match_len));
        }
        else
        {
            /* we have a callback - push arguments */
            int fargc = 0;

            /*
             *   Figure out how many groups are populated, and how many the
             *   function expects.  If the function takes varargs, it expects
             *   all of the groups.  If it takes fixed arguments, it expects
             *   at most max_argc-2.  In addition, the function expects a
             *   minimum of min_argc-2 groups, and expects us to add nil
             *   arguments for any unpopulated groups to fill out that
             *   minimum.
             */
            int gc_actual = G_bif_tads_globals->rex_searcher->get_group_cnt();
            int gc_wanted = (func_argc_max == -1
                             ? gc_actual : func_argc_max - 2);
            if (gc_wanted < func_argc_min - 2)
                gc_wanted = func_argc_min - 2;

            /* push the groups, last to first */
            for (int i = gc_wanted ; i > 0 ; )
            {
                /* get the group, if it exists */
                const re_group_register *reg = 0;
                if (--i < gc_actual)
                {
                    /* valid group - get the group information */
                    reg = G_bif_tads_globals->rex_searcher->get_group_reg(i);
                }

                /* if the group is populated, push its text, otherwise nil */
                if (reg != 0 && reg->start_ofs >= 0 && reg->end_ofs >= 0)
                {
                    /* push the group text as a new string */
                    G_stk->push()->set_obj(CVmObjString::create(
                        vmg_ FALSE, basestr + reg->start_ofs,
                        reg->end_ofs - reg->start_ofs));
                }
                else
                {
                    /* unpopulated group - push nil */
                    G_stk->push()->set_nil();
                }

                /* count it */
                ++fargc;
            }

            /* if the index value is desired, push it */
            if (func_argc_max == -1 || func_argc_max >= 2)
            {
                /* push the index of the match relative to basestr */
                G_stk->push()->set_int(
                    utf8_ptr::s_len(basestr, nxt - basestr) + 1);
                ++fargc;
            }

            /* if the match string value is desired, push it */
            if (func_argc_max == -1 || func_argc_max >= 1)
            {
                /* push the match text */
                G_stk->push()->set_obj(
                    CVmObjString::create(vmg_ FALSE, nxt, match_len));
                ++fargc;
            }

            /* call the callback */
            G_interpreter->call_func_ptr(vmg_ func, fargc, &rc, 0);

            /* retrieve the return value */
            ele = *G_interpreter->get_r0();
        }

        /* add it to the list */
        lst->cons_ensure_space(vmg_ cnt, 0);
        lst->cons_set_element(cnt, &ele);

        /* skip the matched text */
        size_t skip = match_bofs + match_len;
        str += skip;
        len -= skip;

        /* 
         *   if we matched zero characters, skip one character to prevent an
         *   infinite loop 
         */
        if (match_len == 0 && len != 0)
            str += utf8_ptr::s_bytelen(str, 1);
    }

    /* finalize the list length */
    lst->cons_set_len(cnt);

    /* discard arguments and gc protection */
    G_stk->discard(orig_argc + 1);

    /* handled */
    return TRUE;
}